

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFAcceleratorTable.cpp
# Opt level: O2

Optional<unsigned_long> __thiscall llvm::DWARFDebugNames::Entry::getCUOffset(Entry *this)

{
  NameIndex *this_00;
  unsigned_long *puVar1;
  uint64_t uVar2;
  ulong uVar3;
  ulong uVar4;
  undefined8 extraout_RDX;
  undefined8 uVar5;
  Optional<unsigned_long> OVar6;
  anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2 local_20;
  Optional<unsigned_long> Index;
  
  OVar6 = getCUIndex(this);
  local_20 = OVar6.Storage.field_0;
  Index.Storage.field_0.empty = OVar6.Storage.hasVal;
  if (((undefined1  [16])OVar6.Storage & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    puVar1 = optional_detail::OptionalStorage<unsigned_long,_true>::getValue
                       ((OptionalStorage<unsigned_long,_true> *)&local_20);
    this_00 = this->NameIdx;
    if (*puVar1 < (ulong)(this_00->Hdr).super_HeaderPOD.CompUnitCount) {
      puVar1 = optional_detail::OptionalStorage<unsigned_long,_true>::getValue
                         ((OptionalStorage<unsigned_long,_true> *)&local_20);
      uVar2 = NameIndex::getCUOffset(this_00,(uint32_t)*puVar1);
      uVar4 = uVar2 & 0xff;
      uVar3 = uVar2 & 0xffffffffffffff00;
      uVar5 = CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
      goto LAB_00b1c217;
    }
  }
  uVar3 = 0;
  uVar4 = 0;
  uVar5 = 0;
LAB_00b1c217:
  OVar6.Storage.field_0.value = uVar3 | uVar4;
  OVar6.Storage._8_8_ = uVar5;
  return (Optional<unsigned_long>)OVar6.Storage;
}

Assistant:

Optional<uint64_t> DWARFDebugNames::Entry::getCUOffset() const {
  Optional<uint64_t> Index = getCUIndex();
  if (!Index || *Index >= NameIdx->getCUCount())
    return None;
  return NameIdx->getCUOffset(*Index);
}